

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mqtt.c
# Opt level: O0

CURLcode mqtt_do(connectdata *conn,_Bool *done)

{
  Curl_easy *data_00;
  Curl_easy *data;
  CURLcode result;
  _Bool *done_local;
  connectdata *conn_local;
  
  data_00 = conn->data;
  *done = false;
  conn_local._4_4_ = mqtt_connect(conn);
  if (conn_local._4_4_ == CURLE_OK) {
    mqstate(conn,MQTT_FIRST,MQTT_CONNACK);
    conn_local._4_4_ = CURLE_OK;
  }
  else {
    Curl_failf(data_00,"Error %d sending MQTT CONN request",(ulong)conn_local._4_4_);
  }
  return conn_local._4_4_;
}

Assistant:

static CURLcode mqtt_do(struct connectdata *conn, bool *done)
{
  CURLcode result = CURLE_OK;
  struct Curl_easy *data = conn->data;

  *done = FALSE; /* unconditionally */

  result = mqtt_connect(conn);
  if(result) {
    failf(data, "Error %d sending MQTT CONN request", result);
    return result;
  }
  mqstate(conn, MQTT_FIRST, MQTT_CONNACK);
  return CURLE_OK;
}